

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O1

void try_range_check_subtract_real<int>(char *description,bool exp_pass,int *a,int *b)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  
  if ((int)(*(uint *)CONCAT71(in_register_00000031,exp_pass) ^ *a) < 0) {
    QIntC::range_check_subtract_error<int>((int *)CONCAT71(in_register_00000031,exp_pass),a);
  }
  if (description == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f9280);
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,description,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": okay",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

static void
try_range_check_subtract_real(char const* description, bool exp_pass, T const& a, T const& b)
{
    bool passed = false;
    try {
        QIntC::range_check_subtract(a, b);
        std::cout << description << ": okay";
        passed = true;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}